

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

int __thiscall
HModel::util_chgRowBoundsSet
          (HModel *this,int nrows,int *XrowBoundIndex,double *XrowLowerValues,
          double *XrowUpperValues)

{
  uint uVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  
  if (0 < nrows) {
    pdVar2 = (this->rowScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      uVar1 = XrowBoundIndex[uVar5];
      dVar7 = XrowLowerValues[uVar5];
      if (1e+200 <= dVar7) {
        return uVar1 + 1;
      }
      dVar6 = XrowUpperValues[uVar5];
      if (dVar6 <= -1e+200) {
        return ~uVar1;
      }
      if (-1e+200 < dVar7) {
        dVar7 = dVar7 / pdVar2[(int)uVar1];
      }
      pdVar3[(int)uVar1] = dVar7;
      if (dVar6 < 1e+200) {
        dVar6 = dVar6 / pdVar2[(int)uVar1];
      }
      pdVar4[(int)uVar1] = dVar6;
      uVar5 = uVar5 + 1;
    } while ((uint)nrows != uVar5);
  }
  mlFg_Update(this,this->mlFg_action_NewBounds);
  return 0;
}

Assistant:

int HModel::util_chgRowBoundsSet(int nrows, const int* XrowBoundIndex, const double* XrowLowerValues, const double* XrowUpperValues) {
  assert(XrowBoundIndex != NULL);
  assert(XrowLowerValues != NULL);
  assert(XrowUpperValues != NULL);
  for (int ix = 0; ix < nrows; ++ix) {
    int row = XrowBoundIndex[ix];
    assert(0 <= row);
    assert(row < numRow);
    double lower = XrowLowerValues[ix];
    double upper = XrowUpperValues[ix];
    //Check that the lower bound is not being set to +Inf
    if (hsol_isInfinity(lower)) return row+1;
    //Check that the lower bound is not being set to +Inf
    if (hsol_isInfinity(-upper)) return -(row+1);
    rowLower[row] = (hsol_isInfinity(-lower) ? lower : lower / rowScale[row]);
    rowUpper[row] = (hsol_isInfinity( upper) ? upper : upper / rowScale[row]);
    //    printf("Bounds for row %2d are now [%11g, %11g]\n", row, rowLower[row], rowUpper[row]);
  }
  //Deduce the consequences of new bounds
  mlFg_Update(mlFg_action_NewBounds);
  return 0;  
}